

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatmain.c
# Opt level: O0

int ecx_send_processdata_group(ecx_contextt *context,uint8 group)

{
  uint32 uVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  uint16 uVar7;
  ushort local_3c;
  uint16 currentsegment;
  uint8 *puStack_38;
  boolean first;
  uint8 *data;
  int wkc;
  uint32 uStack_20;
  uint8 idx;
  int sublength;
  int length;
  uint16 w2;
  uint16 w1;
  uint32 LogAdr;
  uint8 group_local;
  ecx_contextt *context_local;
  
  local_3c = 0;
  data._4_4_ = 0;
  bVar6 = context->grouplist[group].hasdc != '\0';
  uStack_20 = context->grouplist[group].Obytes + context->grouplist[group].Ibytes;
  length = context->grouplist[group].logstartaddr;
  if (uStack_20 != 0) {
    if (group == '\0') {
      context->idxstack->pushed = '\0';
      context->idxstack->pulled = '\0';
    }
    data._4_4_ = 1;
    if (context->grouplist[group].blockLRW == '\0') {
      if (context->grouplist[group].Obytes == 0) {
        puStack_38 = context->grouplist[group].inputs;
      }
      else {
        puStack_38 = context->grouplist[group].outputs;
      }
      do {
        uVar1 = context->grouplist[group].IOsegment[local_3c];
        uVar4 = ecx_getindex(context->port);
        bVar3 = (byte)uVar4;
        uVar7 = (uint16)uVar1;
        ecx_setupdatagram(context->port,context->port->txbuf + bVar3,'\f',bVar3,(uint16)length,
                          (uint16)((uint)length >> 0x10),uVar7,puStack_38);
        if (bVar6) {
          context->DCl = uVar7;
          iVar5 = ecx_adddatagram(context->port,context->port->txbuf + bVar3,'\x0e',bVar3,'\0',
                                  context->slavelist[context->grouplist[group].DCnext].configadr,
                                  0x910,8,context->DCtime);
          context->DCtO = (uint16)iVar5;
          bVar6 = false;
        }
        ecx_outframe_red(context->port,uVar4 & 0xff);
        ecx_pushindex(context,bVar3,puStack_38,uVar7);
        uStack_20 = uStack_20 - uVar1;
        length = uVar1 + length;
        puStack_38 = puStack_38 + (int)uVar1;
        bVar2 = false;
        if (uStack_20 != 0) {
          bVar2 = (ushort)(local_3c + 1) < context->grouplist[group].nsegments;
        }
        local_3c = local_3c + 1;
      } while (bVar2);
    }
    else {
      if (context->grouplist[group].Ibytes != 0) {
        local_3c = context->grouplist[group].Isegment;
        puStack_38 = context->grouplist[group].inputs;
        uStack_20 = context->grouplist[group].Ibytes;
        length = context->grouplist[group].Obytes + length;
        do {
          if (local_3c == context->grouplist[group].Isegment) {
            wkc = context->grouplist[group].IOsegment[local_3c] -
                  (uint)context->grouplist[group].Ioffset;
          }
          else {
            wkc = context->grouplist[group].IOsegment[local_3c];
          }
          local_3c = local_3c + 1;
          uVar4 = ecx_getindex(context->port);
          bVar3 = (byte)uVar4;
          uVar7 = (uint16)wkc;
          ecx_setupdatagram(context->port,context->port->txbuf + bVar3,'\n',bVar3,(uint16)length,
                            (uint16)((uint)length >> 0x10),uVar7,puStack_38);
          if (bVar6) {
            context->DCl = uVar7;
            iVar5 = ecx_adddatagram(context->port,context->port->txbuf + bVar3,'\x0e',bVar3,'\0',
                                    context->slavelist[context->grouplist[group].DCnext].configadr,
                                    0x910,8,context->DCtime);
            context->DCtO = (uint16)iVar5;
            bVar6 = false;
          }
          ecx_outframe_red(context->port,uVar4 & 0xff);
          ecx_pushindex(context,bVar3,puStack_38,uVar7);
          uStack_20 = uStack_20 - wkc;
          length = wkc + length;
          puStack_38 = puStack_38 + wkc;
          bVar2 = false;
          if (uStack_20 != 0) {
            bVar2 = local_3c < context->grouplist[group].nsegments;
          }
        } while (bVar2);
      }
      if (context->grouplist[group].Obytes != 0) {
        puStack_38 = context->grouplist[group].outputs;
        uStack_20 = context->grouplist[group].Obytes;
        length = context->grouplist[group].logstartaddr;
        local_3c = 0;
        do {
          wkc = context->grouplist[group].IOsegment[local_3c];
          if ((int)(uStack_20 - wkc) < 0) {
            wkc = uStack_20;
          }
          uVar4 = ecx_getindex(context->port);
          bVar3 = (byte)uVar4;
          uVar7 = (uint16)wkc;
          ecx_setupdatagram(context->port,context->port->txbuf + bVar3,'\v',bVar3,(uint16)length,
                            (uint16)((uint)length >> 0x10),uVar7,puStack_38);
          if (bVar6) {
            context->DCl = uVar7;
            iVar5 = ecx_adddatagram(context->port,context->port->txbuf + bVar3,'\x0e',bVar3,'\0',
                                    context->slavelist[context->grouplist[group].DCnext].configadr,
                                    0x910,8,context->DCtime);
            context->DCtO = (uint16)iVar5;
            bVar6 = false;
          }
          ecx_outframe_red(context->port,uVar4 & 0xff);
          ecx_pushindex(context,bVar3,puStack_38,uVar7);
          uStack_20 = uStack_20 - wkc;
          length = wkc + length;
          puStack_38 = puStack_38 + wkc;
          bVar2 = false;
          if (uStack_20 != 0) {
            bVar2 = (ushort)(local_3c + 1) < context->grouplist[group].nsegments;
          }
          local_3c = local_3c + 1;
        } while (bVar2);
      }
    }
  }
  return data._4_4_;
}

Assistant:

int ecx_send_processdata_group(ecx_contextt *context, uint8 group)
{
   uint32 LogAdr;
   uint16 w1, w2;
   int length, sublength;
   uint8 idx;
   int wkc;
   uint8* data;
   boolean first=FALSE;
   uint16 currentsegment = 0;

   wkc = 0;
   if(context->grouplist[group].hasdc)
   {
      first = TRUE;
   }
   length = context->grouplist[group].Obytes + context->grouplist[group].Ibytes;
   LogAdr = context->grouplist[group].logstartaddr;
   if (length)
   {
      if(!group)
      {
         context->idxstack->pushed = 0;
         context->idxstack->pulled = 0;
      }
      wkc = 1;
      /* LRW blocked by one or more slaves ? */
      if (context->grouplist[group].blockLRW)
      {
         /* if inputs available generate LRD */
         if(context->grouplist[group].Ibytes)
         {
            currentsegment = context->grouplist[group].Isegment;
            data = context->grouplist[group].inputs;
            length = context->grouplist[group].Ibytes;
            LogAdr += context->grouplist[group].Obytes;
            /* segment transfer if needed */
            do
            {
               if(currentsegment == context->grouplist[group].Isegment)
               {
                  sublength = context->grouplist[group].IOsegment[currentsegment++] - context->grouplist[group].Ioffset;
               }
               else
               {
                  sublength = context->grouplist[group].IOsegment[currentsegment++];
               }
               /* get new index */
               idx = ecx_getindex(context->port);
               w1 = LO_WORD(LogAdr);
               w2 = HI_WORD(LogAdr);
               ecx_setupdatagram(context->port, &(context->port->txbuf[idx]), EC_CMD_LRD, idx, w1, w2, sublength, data);
               if(first)
               {
                  context->DCl = sublength;
                  /* FPRMW in second datagram */
                  context->DCtO = ecx_adddatagram(context->port, &(context->port->txbuf[idx]), EC_CMD_FRMW, idx, FALSE,
                                           context->slavelist[context->grouplist[group].DCnext].configadr,
                                           ECT_REG_DCSYSTIME, sizeof(context->DCtime), context->DCtime);
                  first = FALSE;
               }
               /* send frame */
               ecx_outframe_red(context->port, idx);
               /* push index and data pointer on stack */
               ecx_pushindex(context, idx, data, sublength);
               length -= sublength;
               LogAdr += sublength;
               data += sublength;
            } while (length && (currentsegment < context->grouplist[group].nsegments));
         }
         /* if outputs available generate LWR */
         if(context->grouplist[group].Obytes)
         {
            data = context->grouplist[group].outputs;
            length = context->grouplist[group].Obytes;
            LogAdr = context->grouplist[group].logstartaddr;
            currentsegment = 0;
            /* segment transfer if needed */
            do
            {
               sublength = context->grouplist[group].IOsegment[currentsegment++];
               if((length - sublength) < 0)
               {
                  sublength = length;
               }
               /* get new index */
               idx = ecx_getindex(context->port);
               w1 = LO_WORD(LogAdr);
               w2 = HI_WORD(LogAdr);
               ecx_setupdatagram(context->port, &(context->port->txbuf[idx]), EC_CMD_LWR, idx, w1, w2, sublength, data);
               if(first)
               {
                  context->DCl = sublength;
                  /* FPRMW in second datagram */
                  context->DCtO = ecx_adddatagram(context->port, &(context->port->txbuf[idx]), EC_CMD_FRMW, idx, FALSE,
                                           context->slavelist[context->grouplist[group].DCnext].configadr,
                                           ECT_REG_DCSYSTIME, sizeof(context->DCtime), context->DCtime);
                  first = FALSE;
               }
               /* send frame */
               ecx_outframe_red(context->port, idx);
               /* push index and data pointer on stack */
               ecx_pushindex(context, idx, data, sublength);
               length -= sublength;
               LogAdr += sublength;
               data += sublength;
            } while (length && (currentsegment < context->grouplist[group].nsegments));
         }
      }
      /* LRW can be used */
      else
      {
         if (context->grouplist[group].Obytes)
         {
            data = context->grouplist[group].outputs;
         }
         else
         {
            data = context->grouplist[group].inputs;
         }
         /* segment transfer if needed */
         do
         {
            sublength = context->grouplist[group].IOsegment[currentsegment++];
            /* get new index */
            idx = ecx_getindex(context->port);
            w1 = LO_WORD(LogAdr);
            w2 = HI_WORD(LogAdr);
            ecx_setupdatagram(context->port, &(context->port->txbuf[idx]), EC_CMD_LRW, idx, w1, w2, sublength, data);
            if(first)
            {
               context->DCl = sublength;
               /* FPRMW in second datagram */
               context->DCtO = ecx_adddatagram(context->port, &(context->port->txbuf[idx]), EC_CMD_FRMW, idx, FALSE,
                                        context->slavelist[context->grouplist[group].DCnext].configadr,
                                        ECT_REG_DCSYSTIME, sizeof(context->DCtime), context->DCtime);
               first = FALSE;
            }
            /* send frame */
            ecx_outframe_red(context->port, idx);
            /* push index and data pointer on stack */
            ecx_pushindex(context, idx, data, sublength);
            length -= sublength;
            LogAdr += sublength;
            data += sublength;
         } while (length && (currentsegment < context->grouplist[group].nsegments));
      }
   }

   return wkc;
}